

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall TPZMatrix<int>::Decompose_Cholesky(TPZMatrix<int> *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int extraout_var;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  int tmp;
  int local_48;
  int local_44;
  long local_40;
  long local_38;
  
  cVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if ((cVar1 != '\0') && (cVar1 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
  }
  if ((this->super_TPZBaseMatrix).fDecomposed == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    local_40 = CONCAT44(extraout_var,iVar2);
    if (local_40 != 0 && -1 < extraout_var) {
      lVar6 = 0;
      do {
        if (lVar6 != 0) {
          lVar5 = 0;
          do {
            iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                              (this,lVar6,lVar5);
            iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                              (this,lVar6,lVar5);
            local_44 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                 (this,lVar6,lVar6);
            local_44 = local_44 - iVar3 * iVar2;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar6,lVar6,&local_44);
            lVar5 = lVar5 + 1;
          } while (lVar6 != lVar5);
        }
        iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar6,lVar6);
        dVar7 = (double)iVar2;
        if (dVar7 < 0.0) {
          dVar7 = sqrt(dVar7);
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        local_44 = (int)dVar7;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar6,lVar6,&local_44);
        lVar5 = lVar6 + 1;
        local_38 = lVar5;
        if (lVar5 < local_40) {
          do {
            if (lVar6 != 0) {
              lVar4 = 0;
              do {
                iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                  (this,lVar6,lVar4);
                iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                  (this,lVar5,lVar4);
                local_48 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                     (this,lVar6,lVar5);
                local_48 = local_48 - iVar3 * iVar2;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                          (this,lVar6,lVar5,&local_48);
                lVar4 = lVar4 + 1;
              } while (lVar6 != lVar4);
            }
            iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                              (this,lVar6,lVar6);
            if (iVar2 == 0) {
              Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
            }
            iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                              (this,lVar6,lVar5);
            local_48 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                 (this,lVar6,lVar6);
            local_48 = iVar2 / local_48;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar6,lVar5,&local_48);
            local_48 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                 (this,lVar6,lVar5);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar5,lVar6,&local_48);
            lVar5 = lVar5 + 1;
          } while (lVar5 < local_40);
        }
        lVar6 = local_38;
      } while (local_38 != local_40);
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky() {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {//diagonal elements
            TVar sum = 0;
            if constexpr (is_complex<TVar>::value){
                sum += GetVal(i,k)*std::conj(GetVal(i,k));
            }else{
                sum += GetVal(i,k)*GetVal(i,k);
            }
            PutVal( i,i,GetVal(i,i)-sum );
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {//off-diagonal elements
            for(int64_t k=0; k<i; k++) {
                TVar sum = 0.;
                if constexpr (is_complex<TVar>::value){
                    sum += GetVal(i,k)*std::conj(GetVal(j,k));
                }else{
                    sum += GetVal(i,k)*GetVal(j,k);
                }
                PutVal( i,j,GetVal(i,j)-sum);
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            if constexpr (is_complex<TVar>::value){
                PutVal(j,i,std::conj(GetVal(i,j)));
            }else{
                PutVal(j,i,GetVal(i,j));
            }
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
	
}